

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::dht_pkt_alert::message_abi_cxx11_(string *__return_storage_ptr__,dht_pkt_alert *this)

{
  endpoint *ep;
  int iVar1;
  span<const_char> sVar2;
  error_code ec;
  bdecode_node print;
  string msg;
  string local_448;
  char buf [1024];
  
  print._32_12_ = SUB1612((undefined1  [16])0x0,4);
  print._16_12_ = SUB1612((undefined1  [16])0x0,0);
  print.m_root_tokens._4_4_ = 0;
  print.m_tokens.
  super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  .
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  print.m_tokens.
  super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  .
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ec.val_ = 0;
  print.m_token_idx = -1;
  print.m_last_index = -1;
  print.m_last_token = -1;
  print.m_size = -1;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  sVar2 = pkt_buf(this);
  iVar1 = 0;
  bdecode(sVar2.m_ptr,sVar2.m_ptr + (int)sVar2.m_len,&print,&ec,(int *)0x0,100,100);
  print_entry_abi_cxx11_(&msg,(libtorrent *)&print,(bdecode_node *)0x1,false,iVar1);
  iVar1 = *(int *)((long)&_ZZNK10libtorrent13dht_pkt_alert7messageB5cxx11EvE6prefix_rel +
                  (ulong)this->direction * 4);
  print_endpoint_abi_cxx11_(&local_448,(libtorrent *)&this->node,ep);
  snprintf(buf,0x400,"%s [%s] %s",
           (long)&_ZZNK10libtorrent13dht_pkt_alert7messageB5cxx11EvE6prefix_rel + (long)iVar1,
           local_448._M_dataplus._M_p,msg._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,buf,(allocator<char> *)&local_448);
  std::__cxx11::string::~string((string *)&msg);
  std::
  _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   *)&print);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_pkt_alert::message() const
	{
		bdecode_node print;
		error_code ec;

		// ignore errors here. This is best-effort. It may be a broken encoding
		// but at least we'll print the valid parts
		span<char const> pkt = pkt_buf();
		bdecode(pkt.data(), pkt.data() + int(pkt.size()), print, ec, nullptr, 100, 100);

		std::string msg = print_entry(print, true);

		static char const* const prefix[2] = {"<==", "==>"};
		char buf[1024];
		std::snprintf(buf, sizeof(buf), "%s [%s] %s", prefix[direction]
			, print_endpoint(node).c_str(), msg.c_str());

		return buf;
	}